

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall dlib::image_display::on_wheel_up(image_display *this,unsigned_long state)

{
  long lVar1;
  long lVar2;
  rectangle *prVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  rectangle result;
  rectangle local_48;
  
  if (this->drawing_rect == false) {
    if ((state & 0x10) == 0) {
      scrollable_region::on_wheel_up(&this->super_scrollable_region,state);
      return;
    }
    lVar5 = *(this->super_scrollable_region).super_drawable.lastx;
    if (((((this->super_scrollable_region).super_drawable.rect.l <= lVar5) &&
         (lVar5 <= (this->super_scrollable_region).super_drawable.rect.r)) &&
        (lVar6 = *(this->super_scrollable_region).super_drawable.lasty,
        (this->super_scrollable_region).super_drawable.rect.t <= lVar6)) &&
       (((lVar6 <= (this->super_scrollable_region).super_drawable.rect.b &&
         ((this->super_scrollable_region).super_drawable.hidden == false)) &&
        ((this->super_scrollable_region).super_drawable.enabled == true)))) {
      if (this->zoom_out_scale == 1 && this->zoom_in_scale < 100) {
        prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar7 = prVar3->l;
        lVar1 = prVar3->t;
        lVar2 = this->zoom_in_scale;
        lVar4 = (lVar2 * 10) / 9 + 1;
        this->zoom_in_scale = lVar4;
        scrollable_region::set_total_rect_size
                  (&this->super_scrollable_region,(this->img).nc_ * lVar4,lVar4 * (this->img).nr_);
        prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar5 = (((lVar5 - lVar7) / lVar2) * this->zoom_in_scale - lVar5) + prVar3->l;
        lVar6 = (((lVar6 - lVar1) / lVar2) * this->zoom_in_scale - lVar6) + prVar3->t;
        prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
        local_48.b = lVar6 + prVar3->b;
        local_48.t = prVar3->t + lVar6;
        local_48.l = prVar3->l + lVar5;
        local_48.r = lVar5 + prVar3->r;
      }
      else {
        if (this->zoom_out_scale == 1) {
          return;
        }
        prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar7 = prVar3->l;
        lVar1 = prVar3->t;
        lVar2 = this->zoom_out_scale;
        lVar4 = 1;
        if (0x12 < lVar2 * 9 + 9U) {
          lVar4 = (lVar2 * 9) / 10;
        }
        this->zoom_out_scale = lVar4;
        scrollable_region::set_total_rect_size
                  (&this->super_scrollable_region,(this->img).nc_ / lVar4,(this->img).nr_ / lVar4);
        prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar7 = (((lVar5 - lVar7) * lVar2) / this->zoom_out_scale - lVar5) + prVar3->l;
        lVar5 = (((lVar6 - lVar1) * lVar2) / this->zoom_out_scale - lVar6) + prVar3->t;
        prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
        local_48.b = lVar5 + prVar3->b;
        local_48.t = prVar3->t + lVar5;
        local_48.l = prVar3->l + lVar7;
        local_48.r = lVar7 + prVar3->r;
      }
      scrollable_region::scroll_to_rect(&this->super_scrollable_region,&local_48);
    }
  }
  return;
}

Assistant:

void image_display::
    on_wheel_up (
        unsigned long state
    )
    {
        // disable mouse wheel if the user is drawing a rectangle
        if (drawing_rect)
            return;

        // if CONTROL is not being held down
        if ((state & base_window::CONTROL) == 0)
        {
            scrollable_region::on_wheel_up(state);
            return;
        }

        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;


        if (zoom_in_scale < 100 && zoom_out_scale == 1)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())/zoom_in_scale;

            zoom_in_scale = zoom_in_scale*10/9 + 1;

            set_total_rect_size(img.nc()*zoom_in_scale, img.nr()*zoom_in_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc*zoom_in_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
        else if (zoom_out_scale != 1)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())*zoom_out_scale;

            zoom_out_scale = zoom_out_scale*9/10;
            if (zoom_out_scale == 0)
                zoom_out_scale = 1;

            set_total_rect_size(img.nc()/zoom_out_scale, img.nr()/zoom_out_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc/zoom_out_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
    }